

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O3

TapBranch * cfd::core::TapBranch::FromString(TapBranch *__return_storage_ptr__,string *text)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  CfdException *pCVar5;
  string *extraout_RDX;
  string *extraout_RDX_00;
  string *extraout_RDX_01;
  string *psVar6;
  string *extraout_RDX_02;
  string *extraout_RDX_03;
  string *extraout_RDX_04;
  string *extraout_RDX_05;
  string *psVar7;
  string *psVar8;
  TapBranch *__return_storage_ptr___00;
  string *psVar9;
  Script *pSVar10;
  string *psVar11;
  bool bVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  text_list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> head;
  TapBranch branch2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  TapBranch local_128;
  string *local_b0;
  TapBranch local_a8;
  
  lVar4 = ::std::__cxx11::string::find((char)text,0x20);
  if (lVar4 != -1) {
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_128._vptr_TapBranch = (_func_int **)&local_128.script_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"Contains invalid charactor.","");
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_128);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  TapBranch(__return_storage_ptr__);
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar7 = (string *)text->_M_string_length;
  psVar6 = extraout_RDX;
  if (psVar7 != (string *)0x0) {
    cVar2 = '\0';
    psVar9 = (string *)0x0;
    psVar11 = (string *)0x0;
    psVar8 = (string *)0x0;
    local_b0 = (string *)0x0;
    do {
      pSVar10 = &local_128.script_;
      bVar1 = (text->_M_dataplus)._M_p[(long)&(psVar11->_M_dataplus)._M_p];
      psVar6 = (string *)(ulong)bVar1;
      if (bVar1 == 0x7d) {
        if (cVar2 == '\0') {
          pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
          local_128._vptr_TapBranch = (_func_int **)pSVar10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_128,"Invalid tree format.","");
          CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_128);
          __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
        }
        cVar2 = cVar2 + -1;
        if (cVar2 == '\0') {
          if (psVar8 == (string *)0x0) {
            pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
            local_128._vptr_TapBranch = (_func_int **)pSVar10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_128,"Invalid tree format. empty split block.","");
            CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_128);
            __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
          }
          if (psVar11 <= psVar8) {
            pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
            local_128._vptr_TapBranch = (_func_int **)pSVar10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_128,"Invalid tree item.","");
            CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_128);
            __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
          }
          ::std::__cxx11::string::substr((ulong)&local_128,(ulong)text);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_148
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_128);
          psVar6 = extraout_RDX_00;
          if ((Script *)local_128._vptr_TapBranch != pSVar10) {
            operator_delete(local_128._vptr_TapBranch);
            psVar6 = extraout_RDX_01;
          }
          cVar2 = '\0';
          local_b0 = psVar11;
        }
      }
      else if (bVar1 == 0x7b) {
        if (cVar2 == '\0') {
          psVar9 = (string *)((long)&(psVar11->_M_dataplus)._M_p + 1);
        }
        cVar2 = cVar2 + '\x01';
        if (cVar2 == -1) {
          pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
          local_128._vptr_TapBranch = (_func_int **)pSVar10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_128,"Invalid tree format.","");
          CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_128);
          __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
        }
      }
      else {
        psVar6 = (string *)(ulong)(bVar1 ^ 0x2c);
        if (cVar2 == '\x01' && (bVar1 ^ 0x2c) == 0) {
          psVar6 = psVar8;
          if (psVar8 == (string *)0x0) {
            psVar6 = psVar9;
          }
          if ((string *)((long)&(psVar6->_M_dataplus)._M_p + 3U) < psVar7) {
            ::std::__cxx11::string::substr((ulong)&local_128,(ulong)text);
            if (psVar11 == (string *)0x0) {
              bVar12 = true;
            }
            else {
              bVar12 = ((text->_M_dataplus)._M_p + -1)[(long)psVar11] != ')';
            }
            iVar3 = ::std::__cxx11::string::compare((char *)&local_128);
            psVar6 = extraout_RDX_02;
            if ((Script *)local_128._vptr_TapBranch != &local_128.script_) {
              operator_delete(local_128._vptr_TapBranch);
              psVar6 = extraout_RDX_03;
            }
            cVar2 = '\x01';
            if ((bool)(iVar3 == 0 & bVar12)) goto LAB_00459214;
          }
          if (psVar8 != (string *)0x0) {
            pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
            local_128._vptr_TapBranch = (_func_int **)&local_128.script_;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_128,"Invalid tree splitformat.","");
            CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_128);
            __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
          }
          ::std::__cxx11::string::substr((ulong)&local_128,(ulong)text);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_148
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_128);
          psVar6 = extraout_RDX_04;
          if ((Script *)local_128._vptr_TapBranch != &local_128.script_) {
            operator_delete(local_128._vptr_TapBranch);
            psVar6 = extraout_RDX_05;
          }
          psVar8 = (string *)((long)&(psVar11->_M_dataplus)._M_p + 1);
          cVar2 = '\x01';
        }
      }
LAB_00459214:
      psVar11 = (string *)((long)&(psVar11->_M_dataplus)._M_p + 1);
      psVar7 = (string *)text->_M_string_length;
    } while (psVar11 < psVar7);
    if (local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (((long)local_148.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_148.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start != 0x40) ||
         (psVar6 = (string *)((long)&(local_b0->_M_dataplus)._M_p + 1), psVar6 < psVar7)) {
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        local_128._vptr_TapBranch = (_func_int **)&local_128.script_;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_128,"Invalid tree format.","");
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_128);
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if (local_148.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_148.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __return_storage_ptr___00 = &local_128;
        FromString::anon_class_1_0_00000001::operator()
                  (__return_storage_ptr___00,
                   (anon_class_1_0_00000001 *)
                   local_148.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,psVar6);
        psVar7 = (string *)
                 ((long)local_148.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_148.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5);
        if (psVar7 < (string *)0x2) {
          ::std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
        }
        FromString::anon_class_1_0_00000001::operator()
                  (&local_a8,
                   (anon_class_1_0_00000001 *)
                   (local_148.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1),psVar7);
        if ((local_128.has_leaf_ == false) && (local_a8.has_leaf_ == true)) {
          AddBranch(&local_a8,&local_128);
          __return_storage_ptr___00 = &local_a8;
        }
        else {
          AddBranch(__return_storage_ptr___00,&local_a8);
        }
        operator=(__return_storage_ptr__,__return_storage_ptr___00);
        ~TapBranch(&local_a8);
        goto LAB_00459308;
      }
    }
  }
  FromString::anon_class_1_0_00000001::operator()(&local_128,(anon_class_1_0_00000001 *)text,psVar6)
  ;
  operator=(__return_storage_ptr__,&local_128);
LAB_00459308:
  ~TapBranch(&local_128);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  return __return_storage_ptr__;
}

Assistant:

TapBranch TapBranch::FromString(const std::string& text) {
  static auto check_tapleaf_func = [](const std::string& text,
                                      TapBranch* branch) -> bool {
    if (text.size() < 6) return false;
    std::string head = text.substr(0, 3);
    if ((head == "tl(") && (*(text.end() - 1) == ')')) {
      size_t leaf_ver_offset = text.find(',');
      if (leaf_ver_offset == std::string::npos) {
        *branch = TaprootScriptTree(Script(text.substr(3, text.length() - 4)));
      } else {
        auto script_str = text.substr(3, leaf_ver_offset - 3);
        auto leaf_ver_str = text.substr(leaf_ver_offset + 1, 2);
        char* err = nullptr;
        auto leaf_version = strtol(leaf_ver_str.c_str(), &err, 16);
        if (((err != nullptr) && (*err != '\0')) || (leaf_version < 0) ||
            (leaf_version > std::numeric_limits<uint8_t>::max())) {
          throw CfdException(
              CfdError::kCfdIllegalArgumentError, "Invalid leaf version.");
        }
        *branch = TaprootScriptTree(
            static_cast<uint8_t>(leaf_version), Script(script_str));
      }
      return true;
    }
    return false;
  };

  static auto analyze_func = [](const std::string& target) -> TapBranch {
    TapBranch result;
    if (*target.begin() == '{') {
      result = TapBranch::FromString(target);  // analyze branch
    } else if (!check_tapleaf_func(target, &result)) {
      result = TapBranch(ByteData256(target));
    }
    return result;
  };

  static auto collect_items_func =
      [](const std::string& text) -> std::vector<std::string> {
    std::vector<std::string> result;
    uint8_t depth = 0;
    size_t start_block_index = 0;
    size_t end_block_index = 0;
    size_t split_index = 0;
    for (size_t idx = 0; idx < text.size(); ++idx) {
      const char& str = text[idx];
      if (str == '{') {
        if (depth == 0) start_block_index = idx + 1;
        ++depth;
        if (depth == std::numeric_limits<uint8_t>::max()) {
          throw CfdException(
              CfdError::kCfdIllegalArgumentError, "Invalid tree format.");
        }
      } else if (str == '}') {
        if (depth == 0) {
          throw CfdException(
              CfdError::kCfdIllegalArgumentError, "Invalid tree format.");
        }
        --depth;
        if (depth == 0) {
          if (split_index == 0) {
            throw CfdException(
                CfdError::kCfdIllegalArgumentError,
                "Invalid tree format. empty split block.");
          }
          end_block_index = idx;
          size_t offset = (split_index == 0) ? start_block_index : split_index;
          if (end_block_index <= offset) {
            throw CfdException(
                CfdError::kCfdIllegalArgumentError, "Invalid tree item.");
          }
          result.emplace_back(text.substr(offset, idx - offset));
        }
      } else if (str == ',') {
        if (depth == 1) {
          size_t offset = (split_index == 0) ? start_block_index : split_index;
          if ((offset + 3) < text.size()) {
            auto head = text.substr(offset, 3);
            char prev_str = 0;
            if (idx > 0) prev_str = text[idx - 1];
            // ignore leaf ver
            if ((head == "tl(") && (prev_str != ')')) continue;
          }

          if (split_index != 0) {
            throw CfdException(
                CfdError::kCfdIllegalArgumentError,
                "Invalid tree splitformat.");
          }
          result.emplace_back(text.substr(offset, idx - offset));
          split_index = idx + 1;
        }
      }
    }

    if (result.empty()) {
      // do nothing
    } else if ((result.size() != 2) || ((end_block_index + 1) < text.size())) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Invalid tree format.");
    }
    return result;
  };

  if (text.find(' ') != std::string::npos) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Contains invalid charactor.");
  }

  TapBranch result;
  auto text_list = collect_items_func(text);
  if (text_list.empty()) {
    result = analyze_func(text);
  } else {
    auto branch1 = analyze_func(text_list.at(0));
    auto branch2 = analyze_func(text_list.at(1));
    if ((!branch1.has_leaf_) && (branch2.has_leaf_)) {
      branch2.AddBranch(branch1);
      result = branch2;
    } else {
      branch1.AddBranch(branch2);
      result = branch1;
    }
  }

  return result;
}